

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void unhexFunc(sqlite3_context *pCtx,int argc,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  u32 uVar5;
  u32 uVar6;
  byte *pbVar7;
  uchar *puVar8;
  byte *p;
  byte *pbVar9;
  long lVar10;
  long in_FS_OFFSET;
  byte *local_48;
  uchar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar7 = sqlite3_value_text(*argv);
  local_48 = pbVar7;
  iVar3 = sqlite3_value_bytes(*argv);
  if (argc == 2) {
    puVar8 = sqlite3_value_text(argv[1]);
    iVar4 = sqlite3_value_bytes(argv[1]);
    lVar10 = (long)iVar4;
  }
  else {
    puVar8 = "";
    lVar10 = 0;
  }
  if (puVar8 == (uchar *)0x0 || pbVar7 == (byte *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    p = (byte *)contextMalloc(pCtx,(long)(iVar3 / 2 + 1));
    if (p == (byte *)0x0) {
      pbVar9 = (byte *)0x0;
    }
    else {
      pbVar9 = p;
      while (bVar2 = *pbVar7, bVar2 != 0) {
        while (uVar5 = (u32)bVar2, (""[bVar2] & 8) == 0) {
          if ((char)bVar2 < '\0') {
            uVar5 = sqlite3Utf8Read(&local_48);
            local_40 = puVar8;
          }
          else {
            local_48 = pbVar7 + 1;
            local_40 = puVar8;
          }
          do {
            if (puVar8 + lVar10 <= local_40) goto LAB_0019b31b;
            uVar6 = (u32)(char)*local_40;
            if ((char)*local_40 < '\0') {
              uVar6 = sqlite3Utf8Read(&local_40);
            }
            else {
              local_40 = local_40 + 1;
            }
          } while (uVar6 != uVar5);
          bVar2 = *local_48;
          pbVar7 = local_48;
          if (bVar2 == 0) goto LAB_0019b343;
        }
        local_48 = pbVar7 + 2;
        bVar1 = pbVar7[1];
        if ((""[bVar1] & 8) == 0) {
LAB_0019b31b:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            sqlite3_free(p);
            return;
          }
          goto LAB_0019b387;
        }
        *pbVar9 = ((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1 & 0xf |
                  (((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2) * '\x10';
        pbVar9 = pbVar9 + 1;
        pbVar7 = local_48;
      }
    }
LAB_0019b343:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3_result_blob(pCtx,p,(int)pbVar9 - (int)p,sqlite3_free);
      return;
    }
  }
LAB_0019b387:
  __stack_chk_fail();
}

Assistant:

static void unhexFunc(
  sqlite3_context *pCtx,
  int argc,
  sqlite3_value **argv
){
  const u8 *zPass = (const u8*)"";
  int nPass = 0;
  const u8 *zHex = sqlite3_value_text(argv[0]);
  int nHex = sqlite3_value_bytes(argv[0]);
#ifdef SQLITE_DEBUG
  const u8 *zEnd = zHex ? &zHex[nHex] : 0;
#endif
  u8 *pBlob = 0;
  u8 *p = 0;

  assert( argc==1 || argc==2 );
  if( argc==2 ){
    zPass = sqlite3_value_text(argv[1]);
    nPass = sqlite3_value_bytes(argv[1]);
  }
  if( !zHex || !zPass ) return;

  p = pBlob = contextMalloc(pCtx, (nHex/2)+1);
  if( pBlob ){
    u8 c;                         /* Most significant digit of next byte */
    u8 d;                         /* Least significant digit of next byte */

    while( (c = *zHex)!=0x00 ){
      while( !sqlite3Isxdigit(c) ){
        u32 ch = Utf8Read(zHex);
        assert( zHex<=zEnd );
        if( !strContainsChar(zPass, nPass, ch) ) goto unhex_null;
        c = *zHex;
        if( c==0x00 ) goto unhex_done;
      }
      zHex++;
      assert( *zEnd==0x00 );
      assert( zHex<=zEnd );
      d = *(zHex++);
      if( !sqlite3Isxdigit(d) ) goto unhex_null;
      *(p++) = (sqlite3HexToInt(c)<<4) | sqlite3HexToInt(d);
    }
  }

 unhex_done:
  sqlite3_result_blob(pCtx, pBlob, (p - pBlob), sqlite3_free);
  return;

 unhex_null:
  sqlite3_free(pBlob);
  return;
}